

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O3

from_chars_result_t<char>
fast_float::from_chars<int,char,int>(char *first,char *last,int *value,int base)

{
  char cVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  undefined8 uVar5;
  byte *pbVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  from_chars_result_t<char> fVar11;
  
  uVar5 = 0x16;
  if (base - 0x25U < 0xffffffdd || first == last) goto LAB_0012e048;
  cVar1 = *first;
  pbVar6 = (byte *)(first + (cVar1 == '-'));
  pbVar4 = pbVar6;
  for (pbVar3 = pbVar6; (pbVar3 != (byte *)last && (pbVar4 = pbVar3, *pbVar3 == 0x30));
      pbVar3 = pbVar3 + 1) {
    pbVar4 = (byte *)last;
  }
  uVar9 = 0;
  pbVar3 = pbVar4;
  if ((base == 10) && (lVar10 = (long)last - (long)pbVar4, 7 < lVar10)) {
    uVar9 = 0;
    do {
      uVar7 = *(long *)pbVar3 + 0xcfcfcfcfcfcfcfd0;
      if (((*(long *)pbVar3 + 0x4646464646464646U | uVar7) & 0x8080808080808080) != 0) break;
      uVar7 = (uVar7 >> 8) + uVar7 * 10;
      uVar9 = ((uVar7 >> 0x10 & 0xff000000ff) * 0x271000000001 +
               (uVar7 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar9 * 100000000;
      pbVar3 = pbVar3 + 8;
      lVar10 = lVar10 + -8;
    } while (7 < lVar10);
  }
  pbVar8 = pbVar3;
  if (pbVar3 != (byte *)last) {
    do {
      pbVar8 = pbVar3;
      if (base <= (int)(uint)int_luts<void>::chdigit[*pbVar3]) break;
      uVar9 = uVar9 * (uint)base + (ulong)int_luts<void>::chdigit[*pbVar3];
      pbVar3 = pbVar3 + 1;
      pbVar8 = (byte *)last;
    } while (pbVar3 != (byte *)last);
  }
  if (pbVar8 == pbVar4) {
    iVar2 = 0;
    uVar5 = 0x16;
    if (pbVar4 <= pbVar6) goto LAB_0012e048;
  }
  else {
    uVar5 = 0x22;
    first = (char *)pbVar8;
    if (*(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0) <
        (ulong)((long)pbVar8 - (long)pbVar4)) goto LAB_0012e048;
    if ((long)pbVar8 - (long)pbVar4 == *(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0))
    {
      uVar7 = 0x7fffffff;
      if (cVar1 == '-') {
        uVar7 = 0x80000000;
      }
      if (uVar9 < int_luts<void>::min_safe_u64[(long)base + -2]) goto LAB_0012e048;
    }
    else {
      uVar7 = 0x7fffffff;
      if (cVar1 == '-') {
        uVar7 = 0x80000000;
      }
    }
    if (uVar7 < uVar9) goto LAB_0012e048;
    iVar2 = -(int)uVar9;
    if (cVar1 != '-') {
      iVar2 = (int)uVar9;
    }
  }
  *value = iVar2;
  uVar5 = 0;
  first = (char *)pbVar8;
LAB_0012e048:
  fVar11._8_8_ = uVar5;
  fVar11.ptr = first;
  return fVar11;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars(UC const* first, UC const* last, T& value, int base) noexcept {
  static_assert (is_supported_char_type<UC>(), "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last || base < 2 || base > 36) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  return parse_int_string(first, last, value, base);
}